

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
::rehash_and_grow_if_necessary
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
           *this)

{
  ulong uVar1;
  
  uVar1 = this->capacity_;
  if (uVar1 == 0) {
    resize(this,1);
    return;
  }
  if ((uVar1 + 1 & uVar1) == 0) {
    if (uVar1 - (uVar1 >> 3) >> 1 < this->size_) {
      resize(this,uVar1 * 2 + 1);
      return;
    }
    drop_deletes_without_resize(this);
    return;
  }
  __assert_fail("IsValidCapacity(capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                ,0x288,"size_t phmap::priv::CapacityToGrowth(size_t)");
}

Assistant:

void rehash_and_grow_if_necessary()
			{
				if (capacity_ == 0) {
					resize(1);
				}
				else if (size() <= CapacityToGrowth(capacity()) / 2) {
					// Squash DELETED without growing if there is enough capacity.
					drop_deletes_without_resize();
				}
				else {
					// Otherwise grow the container.
					resize(capacity_ * 2 + 1);
				}
			}